

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall Chainstate::PruneBlockIndexCandidates(Chainstate *this)

{
  long lVar1;
  const_iterator __position;
  bool bVar2;
  reference ppCVar3;
  long in_RDI;
  long in_FS_OFFSET;
  iterator it;
  set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
  *in_stack_ffffffffffffff98;
  CBlockIndex *in_stack_ffffffffffffffa0;
  CBlockIndex *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::begin
            ((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_> *)
             in_stack_ffffffffffffffa0);
  while( true ) {
    std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::end
              ((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                *)in_stack_ffffffffffffffa0);
    bVar2 = std::operator==((_Self *)in_stack_ffffffffffffffa8,(_Self *)in_stack_ffffffffffffffa0);
    uVar4 = false;
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
      value_comp(in_stack_ffffffffffffff98);
      ppCVar3 = std::_Rb_tree_const_iterator<CBlockIndex_*>::operator*
                          ((_Rb_tree_const_iterator<CBlockIndex_*> *)in_stack_ffffffffffffff98);
      in_stack_ffffffffffffffa8 = *ppCVar3;
      CChain::Tip((CChain *)in_stack_ffffffffffffffa8);
      uVar4 = ::node::CBlockIndexWorkComparator::operator()
                        ((CBlockIndexWorkComparator *)CONCAT17(uVar4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
    if ((bool)uVar4 == false) break;
    in_stack_ffffffffffffffa0 = (CBlockIndex *)(in_RDI + 0x98);
    std::_Rb_tree_const_iterator<CBlockIndex_*>::operator++
              ((_Rb_tree_const_iterator<CBlockIndex_*> *)CONCAT17(uVar4,in_stack_ffffffffffffffb0),
               (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    __position._M_node._7_1_ = uVar4;
    __position._M_node._0_7_ = in_stack_ffffffffffffffb0;
    std::set<CBlockIndex*,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>::
    erase_abi_cxx11_(in_stack_ffffffffffffff98,__position);
  }
  bVar2 = std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
          empty(in_stack_ffffffffffffff98);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
      __stack_chk_fail();
    }
    return;
  }
  __assert_fail("!setBlockIndexCandidates.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                ,0xce3,"void Chainstate::PruneBlockIndexCandidates()");
}

Assistant:

void Chainstate::PruneBlockIndexCandidates() {
    // Note that we can't delete the current block itself, as we may need to return to it later in case a
    // reorganization to a better block fails.
    std::set<CBlockIndex*, CBlockIndexWorkComparator>::iterator it = setBlockIndexCandidates.begin();
    while (it != setBlockIndexCandidates.end() && setBlockIndexCandidates.value_comp()(*it, m_chain.Tip())) {
        setBlockIndexCandidates.erase(it++);
    }
    // Either the current tip or a successor of it we're working towards is left in setBlockIndexCandidates.
    assert(!setBlockIndexCandidates.empty());
}